

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  functest p_Var1;
  testDesc *ptVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  code *__s1_00;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  
  memset(filling,0x61,0x1000);
  filling[0x1000] = '\0';
  xmlMemSetup(xmlMemFree,xmlMemMalloc,xmlMemRealloc,xmlMemoryStrdup);
  xmlInitParser();
  xmlInitializeCatalog();
  xmlCatalogSetDefaults(0);
  __s1_00 = hugeMatch;
  iVar4 = xmlRegisterInputCallbacks(hugeMatch,hugeOpen,hugeRead,hugeClose);
  if (iVar4 < 0) {
    main_cold_2();
LAB_001027b5:
    main_cold_1();
    if ((__s1_00 != (code *)0x0) && (iVar4 = strncmp((char *)__s1_00,"huge:",5), iVar4 == 0)) {
      return 1;
    }
    return 0;
  }
  __s1_00 = crazyMatch;
  iVar4 = xmlRegisterInputCallbacks(crazyMatch,crazyOpen,crazyRead,crazyClose);
  if (iVar4 < 0) goto LAB_001027b5;
  if (1 < argc) {
    bVar11 = false;
    uVar10 = 1;
    do {
      __s1 = argv[uVar10];
      iVar4 = strcmp(__s1,"-v");
      if (iVar4 == 0) {
        verbose = '\x01';
      }
      else {
        iVar4 = strcmp(__s1,"-quiet");
        if (iVar4 == 0) {
          tests_quiet = '\x01';
        }
        else {
          iVar4 = strcmp(__s1,"-crazy");
          if (iVar4 == 0) {
            bVar11 = true;
          }
        }
      }
      uVar10 = uVar10 + 1;
    } while ((uint)argc != uVar10);
    if (bVar11) goto LAB_001025c3;
  }
  ptVar2 = testDescriptions;
  lVar7 = 0;
  do {
    iVar3 = nb_tests;
    iVar4 = nb_errors;
    if ((tests_quiet == '\0') && (testDescriptions[lVar7].desc != (char *)0x0)) {
      printf("## %s\n");
    }
    p_Var1 = ptVar2->func;
    lVar9 = 0;
    do {
      iVar5 = 0;
      if (lVar9 != 0x18 || lVar7 != 0) {
        iVar5 = *(int *)((long)&limitDescriptions[0].fail + lVar9);
      }
      iVar5 = (*p_Var1)(*(char **)((long)&limitDescriptions[0].name + lVar9),
                        *(size_t *)((long)&limitDescriptions[0].limit + lVar9),
                        *(int *)((long)&limitDescriptions[0].options + lVar9),iVar5);
      if (iVar5 != 0) {
        nb_errors = nb_errors + 1;
      }
      lVar9 = lVar9 + 0x18;
    } while (lVar9 != 0x120);
    if (verbose == '\x01') {
      if (nb_errors - iVar4 == 0) {
        printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar3));
      }
      else {
        printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar3),
               (ulong)(uint)(nb_errors - iVar4),0);
      }
    }
    lVar7 = lVar7 + 1;
    ptVar2 = testDescriptions + lVar7;
  } while (lVar7 != 2);
LAB_001025c3:
  iVar3 = nb_tests;
  iVar4 = nb_errors;
  if (tests_quiet == '\0') {
    puts("## Crazy tests on reader");
  }
  if (*crazy != '\0') {
    uVar8 = 1;
    uVar10 = 0;
    do {
      iVar5 = get_crazy_fail(uVar8 - 1);
      crazy_indx = uVar8 - 1;
      iVar5 = readerTest("crazy::test",0x988680,0,iVar5);
      if (iVar5 != 0) {
        nb_errors = nb_errors + 1;
      }
      if (tests_quiet == '\0') {
        fputc((int)crazy[uVar10],_stderr);
      }
      uVar10 = (ulong)uVar8;
      sVar6 = strlen(crazy);
      uVar8 = uVar8 + 1;
    } while (uVar10 < sVar6);
  }
  if (tests_quiet == '\0') {
    puts("\n## Crazy tests on SAX");
  }
  if (*crazy != '\0') {
    uVar8 = 1;
    uVar10 = 0;
    do {
      iVar5 = get_crazy_fail(uVar8 - 1);
      crazy_indx = uVar8 - 1;
      iVar5 = saxTest("crazy::test",0x988680,0,iVar5);
      if (iVar5 != 0) {
        nb_errors = nb_errors + 1;
      }
      if (tests_quiet == '\0') {
        fputc((int)crazy[uVar10],_stderr);
      }
      uVar10 = (ulong)uVar8;
      sVar6 = strlen(crazy);
      uVar8 = uVar8 + 1;
    } while (uVar10 < sVar6);
  }
  if (tests_quiet == '\0') {
    fputc(10,_stderr);
  }
  if (verbose == '\x01') {
    if (nb_errors - iVar4 == 0) {
      printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar3));
    }
    else {
      printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar3),
             (ulong)(uint)(nb_errors - iVar4),0);
    }
  }
  bVar11 = nb_errors == 0;
  if (bVar11) {
    printf("Total %d tests, no errors\n",(ulong)(uint)nb_tests);
  }
  else {
    printf("Total %d tests, %d errors, %d leaks\n",(ulong)(uint)nb_tests,(ulong)(uint)nb_errors,0);
  }
  xmlCleanupParser();
  return (uint)!bVar11;
}

Assistant:

int
main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    int i, a, ret = 0;
    int subset = 0;

    fillFilling();
    initializeLibxml2();

    for (a = 1; a < argc;a++) {
        if (!strcmp(argv[a], "-v"))
	    verbose = 1;
        else if (!strcmp(argv[a], "-quiet"))
	    tests_quiet = 1;
        else if (!strcmp(argv[a], "-crazy"))
	    subset = 1;
    }
    if (subset == 0) {
	for (i = 0; testDescriptions[i].func != NULL; i++) {
	    ret += runtest(i);
	}
    }
    ret += runcrazy();
    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
        ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
    }
    xmlCleanupParser();

    return(ret);
}